

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent indent)

{
  char cVar1;
  cmMakefile *mf;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  size_t sVar6;
  ostream *poVar7;
  WrapQuotes in_R8D;
  pointer pbVar8;
  size_type sVar9;
  pointer ppVar10;
  string_view str;
  string sStack_b8;
  string sStack_98;
  string sStack_78;
  pointer pbStack_58;
  pointer pbStack_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_48;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  mf = this->Test->Makefile;
  std::__cxx11::string::string((string *)&sStack_98,(string *)&this->Test->Name);
  bVar5 = anon_unknown.dwarf_9fb912::needToQuoteTestName(mf,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::string((string *)&sStack_78,(string *)&this->Test->Name);
  sVar6 = anon_unknown.dwarf_9fb912::countMaxConsecutiveEqualSigns(&sStack_78);
  sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
  std::__cxx11::string::_M_construct((ulong)&sStack_98,(char)sVar6 + '\x01');
  std::__cxx11::string::~string((string *)&sStack_78);
  pcVar2 = this->Test;
  std::__cxx11::string::string
            ((string *)&sStack_78,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_78);
  if (bVar5) {
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"add_test([");
    poVar7 = std::operator<<(poVar7,(string *)&sStack_98);
    poVar7 = std::operator<<(poVar7,"[");
    std::__cxx11::string::string((string *)&sStack_b8,(string *)&this->Test->Name);
    poVar7 = std::operator<<(poVar7,(string *)&sStack_b8);
    poVar7 = std::operator<<(poVar7,"]");
    poVar7 = std::operator<<(poVar7,(string *)&sStack_98);
    poVar7 = std::operator<<(poVar7,"] \"");
    poVar7 = std::operator<<(poVar7,(string *)&sStack_78);
    std::operator<<(poVar7,"\"");
  }
  else {
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"add_test(");
    std::__cxx11::string::string((string *)&sStack_b8,(string *)&this->Test->Name);
    poVar7 = std::operator<<(poVar7,(string *)&sStack_b8);
    poVar7 = std::operator<<(poVar7," \"");
    poVar7 = std::operator<<(poVar7,(string *)&sStack_78);
    std::operator<<(poVar7,"\"");
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  pbStack_58 = (pcVar2->Command).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar8 + 1 != pbStack_58) {
    pbStack_50 = pbVar8 + 1;
    std::operator<<(os," \"");
    pcVar3 = pbVar8[1]._M_dataplus._M_p;
    sVar4 = pbVar8[1]._M_string_length;
    for (sVar9 = 0; sVar4 != sVar9; sVar9 = sVar9 + 1) {
      cVar1 = pcVar3[sVar9];
      if (cVar1 == '\"') {
        std::operator<<(os,'\\');
      }
      std::operator<<(os,cVar1);
    }
    std::operator<<(os,'\"');
    pbVar8 = pbStack_50;
  }
  std::operator<<(os,")\n");
  if (bVar5) {
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"set_tests_properties([");
    poVar7 = std::operator<<(poVar7,(string *)&sStack_98);
    poVar7 = std::operator<<(poVar7,"[");
    std::__cxx11::string::string((string *)&sStack_b8,(string *)&this->Test->Name);
    poVar7 = std::operator<<(poVar7,(string *)&sStack_b8);
    poVar7 = std::operator<<(poVar7,"]");
    poVar7 = std::operator<<(poVar7,(string *)&sStack_98);
    std::operator<<(poVar7,"] PROPERTIES ");
  }
  else {
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"set_tests_properties(");
    std::__cxx11::string::string((string *)&sStack_b8,(string *)&this->Test->Name);
    poVar7 = std::operator<<(poVar7,(string *)&sStack_b8);
    std::operator<<(poVar7," PROPERTIES ");
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  cmPropertyMap::GetList_abi_cxx11_(&vStack_48,&this->Test->Properties);
  for (ppVar10 = vStack_48.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVar10 !=
      vStack_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar10 = ppVar10 + 1) {
    poVar7 = std::operator<<(os," ");
    poVar7 = std::operator<<(poVar7,(string *)ppVar10);
    poVar7 = std::operator<<(poVar7," ");
    str._M_str = (char *)0x0;
    str._M_len = (size_t)(ppVar10->second)._M_dataplus._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&sStack_b8,(cmOutputConverter *)(ppVar10->second)._M_string_length,str,in_R8D);
    std::operator<<(poVar7,(string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_48);
  GenerateInternalProperties(this,os);
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_98);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os, Indent indent)
{
  if (this->ActionsPerConfig) {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
  } else {
    // This is an old-style test, so there is only one config.
    // assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
  }
}